

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O0

Cursor __thiscall Am_Cursor_Data::Get_X_Cursor(Am_Cursor_Data *this,Am_Drawonable_Impl *draw)

{
  bool bVar1;
  int iVar2;
  Am_Wrapper *pAVar3;
  Am_Image_Array_Data *this_00;
  Am_Image_Array_Data *this_01;
  Am_Style_Data *this_02;
  Am_Style_Data *this_03;
  ostream *poVar4;
  Cursor CVar5;
  Cursor cursor;
  int used_y_hot;
  int used_x_hot;
  XColor bg_col;
  XColor fg_col;
  Am_Style_Data *bg_data;
  Am_Style_Data *fg_data;
  Am_Image_Array_Data *im_mask;
  Am_Image_Array_Data *im;
  Am_Drawonable_Impl *draw_local;
  Am_Cursor_Data *this_local;
  
  bVar1 = Am_Image_Array::Valid(&this->image);
  if (!bVar1) {
    return 0;
  }
  pAVar3 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->image);
  this_00 = Am_Image_Array_Data::Narrow(pAVar3);
  pAVar3 = Am_Image_Array::operator_cast_to_Am_Wrapper_(&this->mask);
  this_01 = Am_Image_Array_Data::Narrow(pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&this->fg_color);
  this_02 = Am_Style_Data::Narrow(pAVar3);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&this->bg_color);
  this_03 = Am_Style_Data::Narrow(pAVar3);
  if ((((this_00 == (Am_Image_Array_Data *)0x0) || (this_01 == (Am_Image_Array_Data *)0x0)) ||
      (this_02 == (Am_Style_Data *)0x0)) || (this_03 == (Am_Style_Data *)0x0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in making cursor ");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  join_0x00000010_0x00000000_ = Am_Style_Data::Get_X_Color(this_02,draw);
  _used_y_hot = Am_Style_Data::Get_X_Color(this_03,draw);
  Am_Image_Array_Data::Get_X_Pixmap(this_00,draw);
  Am_Image_Array_Data::Get_X_Pixmap(this_01,draw);
  iVar2 = Am_Image_Array_Data::Get_Depth(this_00);
  if ((1 < iVar2) || (iVar2 = Am_Image_Array_Data::Get_Depth(this_01), 1 < iVar2)) {
    Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");
  }
  if (this_02 != (Am_Style_Data *)0x0) {
    Am_Wrapper::Release(&this_02->super_Am_Wrapper);
  }
  if (this_03 != (Am_Style_Data *)0x0) {
    Am_Wrapper::Release(&this_03->super_Am_Wrapper);
  }
  Am_Image_Array_Data::Get_Hot_Spot(this_00,(int *)((long)&cursor + 4),(int *)&cursor);
  if ((cursor._4_4_ == -1) || ((int)cursor == -1)) {
    cursor._4_4_ = this->x_hot;
    cursor._0_4_ = this->y_hot;
  }
  if ((cursor._4_4_ == -1) || ((int)cursor == -1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cursor has no hot spot");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    CVar5 = XCreatePixmapCursor(draw->screen->display,this_00->main_bitmap,this_01->main_bitmap,
                                &bg_col.red,&used_y_hot,cursor._4_4_,(int)cursor);
    if (CVar5 == 8) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Bad Match error in making cursor ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    if (CVar5 == 0xb) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Bad Alloc error in making cursor ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    if (CVar5 == 4) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Bad Pixmap error in making cursor ");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    this->main_cursor = CVar5;
  }
  if (this_00 != (Am_Image_Array_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  if (this_01 != (Am_Image_Array_Data *)0x0) {
    Am_Wrapper::Release(&this_01->super_Am_Wrapper);
  }
  return this->main_cursor;
}

Assistant:

Cursor
Am_Cursor_Data::Get_X_Cursor(Am_Drawonable_Impl *draw)
{
  // get the pointers to the images and the colors
  if (!image.Valid()) {
    return 0;
  }

  Am_Image_Array_Data *im = Am_Image_Array_Data::Narrow(image);
  Am_Image_Array_Data *im_mask = Am_Image_Array_Data::Narrow(mask);
  Am_Style_Data *fg_data = Am_Style_Data::Narrow(fg_color);
  Am_Style_Data *bg_data = Am_Style_Data::Narrow(bg_color);

  if (!(im && im_mask && fg_data && bg_data)) {
    std::cerr << "Error in making cursor " << std::endl;
    Am_Error();
    return 0;
  }

  // now actually get the images and the colors
  XColor fg_col = fg_data->Get_X_Color(draw);
  XColor bg_col = bg_data->Get_X_Color(draw);
  im->Get_X_Pixmap(draw);
  im_mask->Get_X_Pixmap(draw);
  if ((im->Get_Depth() > 1) || (im_mask->Get_Depth() > 1))
    Am_Error("** Tried to make a cursor out of a pixmap with depth > 1\n");

  if (fg_data)
    fg_data->Release();
  if (bg_data)
    bg_data->Release();

  // get the hot spot
  int used_x_hot, used_y_hot;
  im->Get_Hot_Spot(used_x_hot, used_y_hot);

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    used_x_hot = x_hot;
    used_y_hot = y_hot;
  }

  if ((used_x_hot == -1) || (used_y_hot == -1)) {
    std::cerr << "Cursor has no hot spot" << std::endl;
  } else {
    // make a cursor
    Cursor cursor = XCreatePixmapCursor(draw->screen->display, im->main_bitmap,
                                        im_mask->main_bitmap, &fg_col, &bg_col,
                                        used_x_hot, used_y_hot);
    if (cursor == BadMatch) {
      std::cerr << "Bad Match error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadAlloc) {
      std::cerr << "Bad Alloc error in making cursor " << std::endl;
      Am_Error();
    } else if (cursor == BadPixmap) {
      std::cerr << "Bad Pixmap error in making cursor " << std::endl;
      Am_Error();
    }
    main_cursor = cursor;
  }

  if (im)
    im->Release();
  if (im_mask)
    im_mask->Release();

  return main_cursor;
}